

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_pages.c
# Opt level: O1

HPDF_Annotation
HPDF_Page_CreateStampAnnot
          (HPDF_Page page,HPDF_Rect rect,HPDF_StampAnnotName name,char *text,HPDF_Encoder encoder)

{
  HPDF_Annotation annot;
  HPDF_STATUS HVar1;
  
  if (((page != (HPDF_Page)0x0) && (page->attr != (void *)0x0)) &&
     ((page->header).obj_class == 0x411)) {
    annot = HPDF_StampAnnot_New(page->mmgr,*(HPDF_Xref_conflict *)((long)page->attr + 0x78),rect,
                                name,text,encoder);
    if ((annot != (HPDF_Annotation)0x0) && (HVar1 = AddAnnotation(page,annot), HVar1 == 0)) {
      return annot;
    }
    HPDF_CheckError(page->error);
  }
  return (HPDF_Annotation)0x0;
}

Assistant:

HPDF_EXPORT(HPDF_Annotation)
HPDF_Page_CreateStampAnnot  (    HPDF_Page          page,
                                HPDF_Rect           rect,
                                HPDF_StampAnnotName name,
                                const char*         text,
                                HPDF_Encoder        encoder)
{
    HPDF_PageAttr attr;
    HPDF_Annotation annot;

    HPDF_PTRACE((" HPDF_Page_CreateStampAnnot\n"));

    if (!HPDF_Page_Validate (page))
        return NULL;

    attr = (HPDF_PageAttr)page->attr;

    annot = HPDF_StampAnnot_New ( page->mmgr, attr->xref, rect, name, text, encoder);
    if (annot) {
        if (AddAnnotation (page, annot) != HPDF_OK) {
            HPDF_CheckError (page->error);
            annot = NULL;
        }
    } else
        HPDF_CheckError (page->error);

    return annot;
}